

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

DockPosition __thiscall QToolBarAreaLayout::findToolBar(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  undefined8 *puVar1;
  QToolBarAreaLayoutLine *pQVar2;
  QToolBar *pQVar3;
  long lVar4;
  int j;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
      return DockCount;
    }
    for (uVar5 = 0; uVar7 = 0xffffffffffffffff, uVar5 < (ulong)this->docks[lVar4].lines.d.size;
        uVar5 = uVar5 + 1) {
      pQVar2 = this->docks[lVar4].lines.d.ptr;
      lVar6 = 0;
      while (uVar7 = uVar7 + 1, uVar7 < (ulong)pQVar2[uVar5].toolBarItems.d.size) {
        puVar1 = (undefined8 *)((long)&(pQVar2[uVar5].toolBarItems.d.ptr)->widgetItem + lVar6);
        lVar6 = lVar6 + 0x18;
        pQVar3 = (QToolBar *)(**(code **)(*(long *)*puVar1 + 0x68))();
        if (pQVar3 == toolBar) {
          return (DockPosition)lVar4;
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

QInternal::DockPosition QToolBarAreaLayout::findToolBar(const QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return static_cast<QInternal::DockPosition>(i);
            }
        }
    }

    return QInternal::DockCount;
}